

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btSoftBody_*>::remove
          (btAlignedObjectArray<btSoftBody_*> *this,char *__filename)

{
  int iVar1;
  btSoftBody *pbVar2;
  uint uVar3;
  btSoftBody **ppbVar4;
  
  uVar3 = findLinearSearch(this,(btSoftBody **)__filename);
  ppbVar4 = (btSoftBody **)(ulong)uVar3;
  iVar1 = this->m_size;
  if ((int)uVar3 < iVar1) {
    ppbVar4 = this->m_data;
    pbVar2 = ppbVar4[(int)uVar3];
    ppbVar4[(int)uVar3] = ppbVar4[(long)iVar1 + -1];
    ppbVar4 = this->m_data;
    ppbVar4[(long)iVar1 + -1] = pbVar2;
    this->m_size = iVar1 + -1;
  }
  return (int)ppbVar4;
}

Assistant:

void	remove(const T& key)
	{

		int findIndex = findLinearSearch(key);
		if (findIndex<size())
		{
			swap( findIndex,size()-1);
			pop_back();
		}
	}